

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

bool __thiscall absl::lts_20250127::Cord::Contains(Cord *this,Cord *rhs)

{
  bool bVar1;
  bool local_149;
  CharIterator local_148;
  CharIterator local_b0;
  Cord *local_18;
  Cord *rhs_local;
  Cord *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  bVar1 = empty(rhs);
  local_149 = true;
  if (!bVar1) {
    Find(&local_b0,this,local_18);
    char_end(&local_148,this);
    local_149 = CharIterator::operator!=(&local_b0,&local_148);
  }
  return local_149;
}

Assistant:

bool Cord::Contains(const absl::Cord& rhs) const {
  return rhs.empty() || Find(rhs) != char_end();
}